

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_4.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  exception *e;
  Date tomorrow;
  exception *local_18;
  Date today;
  
  today.m = 0;
  Date::Date((Date *)&local_18,0x7ba,jun,0x1a);
  tomorrow.y = today.y;
  e = local_18;
  Date::add_day((Date *)&e,10);
  poVar1 = operator<<((ostream *)&std::cout,(Date *)&local_18);
  poVar1 = std::operator<<(poVar1,'\n');
  poVar1 = operator<<(poVar1,(Date *)&e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main()
{
	try
	{
		Date today{ 1978, Month::jun, 26 };
		Date tomorrow = today;
		tomorrow.add_day(10);
		std::cout << today
			<< '\n' << tomorrow << std::endl;
	}
	catch (const std::exception& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}